

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O3

void compute_quantized_weights_for_decimation
               (decimation_info *di,float low_bound,float high_bound,float *dec_weight_ideal_value,
               float *weight_set_out,uint8_t *quantized_weight_set,quant_method quant_level)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  float fVar10;
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 in_register_00001244 [60];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar32 [64];
  
  auVar13._4_60_ = in_register_00001244;
  auVar13._0_4_ = high_bound;
  auVar11._4_60_ = in_register_00001204;
  auVar11._0_4_ = low_bound;
  uVar7 = (ulong)di->weight_count;
  if (uVar7 != 0) {
    uVar8 = (ulong)quant_level;
    uVar9 = 0xffffffff;
    if (quant_level < (QUANT_256|QUANT_3)) {
      uVar9 = *(undefined4 *)(&DAT_0032c720 + uVar8 * 4);
    }
    auVar2 = vcmpss_avx(auVar13._0_16_,auVar11._0_16_,6);
    auVar16._8_4_ = 0x3f800000;
    auVar16._0_8_ = 0x3f8000003f800000;
    auVar16._12_4_ = 0x3f800000;
    auVar2 = vblendvps_avx(auVar16,auVar13._0_16_,auVar2);
    if (high_bound <= low_bound) {
      auVar11 = ZEXT1264(ZEXT812(0));
    }
    auVar12._4_4_ = uVar9;
    auVar12._0_4_ = uVar9;
    auVar12._8_4_ = uVar9;
    auVar12._12_4_ = uVar9;
    auVar12._16_4_ = uVar9;
    auVar12._20_4_ = uVar9;
    auVar12._24_4_ = uVar9;
    auVar12._28_4_ = uVar9;
    fVar10 = auVar11._0_4_;
    fVar5 = auVar2._0_4_ - fVar10;
    fVar14 = 1.0 / fVar5;
    fVar4 = fVar10 * fVar14;
    fVar5 = fVar5 * 0.015625;
    auVar15._4_4_ = fVar4;
    auVar15._0_4_ = fVar4;
    auVar15._8_4_ = fVar4;
    auVar15._12_4_ = fVar4;
    auVar15._16_4_ = fVar4;
    auVar15._20_4_ = fVar4;
    auVar15._24_4_ = fVar4;
    auVar15._28_4_ = fVar4;
    fVar4 = compute_quantized_weights_for_decimation::quant_levels_m1[uVar8];
    auVar2 = vlddqu_avx(*(undefined1 (*) [16])quant_and_xfer_tables[uVar8].quant_to_unquant);
    if (quant_level - QUANT_20 < 0xc) {
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])
                            (quant_and_xfer_tables[uVar8].quant_to_unquant + 0x10));
      auVar17._16_16_ = auVar2;
      auVar17._0_16_ = auVar2;
      auVar19._0_8_ = auVar16._0_8_ ^ auVar2._0_8_;
      auVar19._8_8_ = auVar16._8_8_ ^ auVar2._8_8_;
      auVar20._16_16_ = auVar19;
      auVar20._0_16_ = auVar19;
      uVar8 = 0;
      auVar25._8_4_ = 0xffffff00;
      auVar25._0_8_ = 0xffffff00ffffff00;
      auVar25._12_4_ = 0xffffff00;
      auVar25._16_4_ = 0xffffff00;
      auVar25._20_4_ = 0xffffff00;
      auVar25._24_4_ = 0xffffff00;
      auVar25._28_4_ = 0xffffff00;
      auVar27[8] = 0xf0;
      auVar27._0_8_ = 0xf0f0f0f0f0f0f0f0;
      auVar27[9] = 0xf0;
      auVar27[10] = 0xf0;
      auVar27[0xb] = 0xf0;
      auVar27[0xc] = 0xf0;
      auVar27[0xd] = 0xf0;
      auVar27[0xe] = 0xf0;
      auVar27[0xf] = 0xf0;
      auVar27[0x10] = 0xf0;
      auVar27[0x11] = 0xf0;
      auVar27[0x12] = 0xf0;
      auVar27[0x13] = 0xf0;
      auVar27[0x14] = 0xf0;
      auVar27[0x15] = 0xf0;
      auVar27[0x16] = 0xf0;
      auVar27[0x17] = 0xf0;
      auVar27[0x18] = 0xf0;
      auVar27[0x19] = 0xf0;
      auVar27[0x1a] = 0xf0;
      auVar27[0x1b] = 0xf0;
      auVar27[0x1c] = 0xf0;
      auVar27[0x1d] = 0xf0;
      auVar27[0x1e] = 0xf0;
      auVar27[0x1f] = 0xf0;
      do {
        pfVar1 = dec_weight_ideal_value + uVar8;
        auVar32._0_4_ = fVar14 * *pfVar1;
        auVar32._4_4_ = fVar14 * pfVar1[1];
        auVar32._8_4_ = fVar14 * pfVar1[2];
        auVar32._12_4_ = fVar14 * pfVar1[3];
        auVar32._16_4_ = fVar14 * pfVar1[4];
        auVar32._20_4_ = fVar14 * pfVar1[5];
        auVar32._28_36_ = in_ZMM15._28_36_;
        auVar32._24_4_ = fVar14 * pfVar1[6];
        auVar18 = vsubps_avx(auVar32._0_32_,auVar15);
        auVar18 = vmaxps_avx(auVar18,_DAT_003260a0);
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar22._16_4_ = 0x3f800000;
        auVar22._20_4_ = 0x3f800000;
        auVar22._24_4_ = 0x3f800000;
        auVar22._28_4_ = 0x3f800000;
        auVar18 = vminps_avx(auVar18,auVar22);
        auVar23._0_4_ = (int)(auVar18._0_4_ * fVar4);
        auVar23._4_4_ = (int)(auVar18._4_4_ * fVar4);
        auVar23._8_4_ = (int)(auVar18._8_4_ * fVar4);
        auVar23._12_4_ = (int)(auVar18._12_4_ * fVar4);
        auVar23._16_4_ = (int)(auVar18._16_4_ * fVar4);
        auVar23._20_4_ = (int)(auVar18._20_4_ * fVar4);
        auVar23._24_4_ = (int)(auVar18._24_4_ * fVar4);
        auVar23._28_4_ = 1;
        auVar24 = vpsubd_avx2(auVar23,_DAT_0032b200);
        auVar28 = vpminsd_avx2(auVar24,auVar12);
        auVar24 = vpor_avx2(auVar23,auVar25);
        auVar21 = vpshufb_avx2(auVar17,auVar24);
        auVar24 = vpaddb_avx2(auVar24,auVar27);
        auVar31 = vpshufb_avx2(auVar20,auVar24);
        auVar24 = vpor_avx2(auVar28,auVar25);
        auVar26 = vpshufb_avx2(auVar17,auVar24);
        auVar24 = vpaddb_avx2(auVar24,auVar27);
        auVar22 = vpshufb_avx2(auVar20,auVar24);
        auVar28 = vcvtdq2ps_avx(auVar31 ^ auVar21);
        auVar3 = vcvtdq2ps_avx(auVar22 ^ auVar26);
        auVar30._0_4_ = auVar28._0_4_ + auVar3._0_4_;
        auVar30._4_4_ = auVar28._4_4_ + auVar3._4_4_;
        auVar30._8_4_ = auVar28._8_4_ + auVar3._8_4_;
        auVar30._12_4_ = auVar28._12_4_ + auVar3._12_4_;
        auVar30._16_4_ = auVar28._16_4_ + auVar3._16_4_;
        auVar30._20_4_ = auVar28._20_4_ + auVar3._20_4_;
        auVar30._24_4_ = auVar28._24_4_ + auVar3._24_4_;
        auVar30._28_4_ = auVar28._28_4_ + auVar3._28_4_;
        auVar6._4_4_ = auVar18._4_4_ * 128.0;
        auVar6._0_4_ = auVar18._0_4_ * 128.0;
        auVar6._8_4_ = auVar18._8_4_ * 128.0;
        auVar6._12_4_ = auVar18._12_4_ * 128.0;
        auVar6._16_4_ = auVar18._16_4_ * 128.0;
        auVar6._20_4_ = auVar18._20_4_ * 128.0;
        auVar6._24_4_ = auVar18._24_4_ * 128.0;
        auVar6._28_4_ = auVar18._28_4_;
        in_ZMM15 = ZEXT3264(auVar6);
        auVar24 = vcmpps_avx(auVar30,auVar6,1);
        auVar18 = vblendvps_avx(auVar31 ^ auVar21,auVar22 ^ auVar26,auVar24);
        auVar24 = vblendvps_avx(auVar28,auVar3,auVar24);
        auVar18 = vpshufb_avx2(auVar18,_DAT_0032c680);
        pfVar1 = weight_set_out + uVar8;
        *pfVar1 = auVar24._0_4_ * fVar5 + fVar10;
        pfVar1[1] = auVar24._4_4_ * fVar5 + fVar10;
        pfVar1[2] = auVar24._8_4_ * fVar5 + fVar10;
        pfVar1[3] = auVar24._12_4_ * fVar5 + fVar10;
        pfVar1[4] = auVar24._16_4_ * fVar5 + fVar10;
        pfVar1[5] = auVar24._20_4_ * fVar5 + fVar10;
        pfVar1[6] = auVar24._24_4_ * fVar5 + fVar10;
        pfVar1[7] = auVar24._28_4_ + fVar10;
        auVar2 = vpunpckldq_avx(auVar18._0_16_,auVar18._16_16_);
        *(long *)(quantized_weight_set + uVar8) = auVar2._0_8_;
        uVar8 = uVar8 + 8;
      } while (uVar8 < uVar7);
    }
    else {
      auVar18._16_16_ = auVar2;
      auVar18._0_16_ = auVar2;
      uVar8 = 0;
      auVar24._8_4_ = 0xffffff00;
      auVar24._0_8_ = 0xffffff00ffffff00;
      auVar24._12_4_ = 0xffffff00;
      auVar24._16_4_ = 0xffffff00;
      auVar24._20_4_ = 0xffffff00;
      auVar24._24_4_ = 0xffffff00;
      auVar24._28_4_ = 0xffffff00;
      auVar28._16_16_ = _DAT_00277870;
      auVar28._0_16_ = _DAT_00277870;
      do {
        pfVar1 = dec_weight_ideal_value + uVar8;
        auVar29._0_4_ = fVar14 * *pfVar1;
        auVar29._4_4_ = fVar14 * pfVar1[1];
        auVar29._8_4_ = fVar14 * pfVar1[2];
        auVar29._12_4_ = fVar14 * pfVar1[3];
        auVar29._16_4_ = fVar14 * pfVar1[4];
        auVar29._20_4_ = fVar14 * pfVar1[5];
        auVar29._28_36_ = in_ZMM13._28_36_;
        auVar29._24_4_ = fVar14 * pfVar1[6];
        auVar17 = vsubps_avx(auVar29._0_32_,auVar15);
        auVar17 = vmaxps_avx(auVar17,_DAT_003260a0);
        auVar21._8_4_ = 0x3f800000;
        auVar21._0_8_ = 0x3f8000003f800000;
        auVar21._12_4_ = 0x3f800000;
        auVar21._16_4_ = 0x3f800000;
        auVar21._20_4_ = 0x3f800000;
        auVar21._24_4_ = 0x3f800000;
        auVar21._28_4_ = 0x3f800000;
        auVar17 = vminps_avx(auVar17,auVar21);
        auVar31._0_4_ = (int)(auVar17._0_4_ * fVar4);
        auVar31._4_4_ = (int)(auVar17._4_4_ * fVar4);
        auVar31._8_4_ = (int)(auVar17._8_4_ * fVar4);
        auVar31._12_4_ = (int)(auVar17._12_4_ * fVar4);
        auVar31._16_4_ = (int)(auVar17._16_4_ * fVar4);
        auVar31._20_4_ = (int)(auVar17._20_4_ * fVar4);
        auVar31._24_4_ = (int)(auVar17._24_4_ * fVar4);
        auVar31._28_4_ = (int)in_ZMM14._28_4_;
        auVar3 = vpsubd_avx2(auVar31,_DAT_0032b200);
        auVar3 = vpminsd_avx2(auVar3,auVar12);
        auVar21 = vpor_avx2(auVar31,auVar24);
        auVar20 = vpshufb_avx2(auVar18,auVar21);
        in_ZMM14 = ZEXT3264(auVar20);
        auVar3 = vpor_avx2(auVar3,auVar24);
        auVar25 = vpshufb_avx2(auVar18,auVar3);
        auVar21 = vcvtdq2ps_avx(auVar20);
        auVar31 = vcvtdq2ps_avx(auVar25);
        auVar26._0_4_ = auVar31._0_4_ + auVar21._0_4_;
        auVar26._4_4_ = auVar31._4_4_ + auVar21._4_4_;
        auVar26._8_4_ = auVar31._8_4_ + auVar21._8_4_;
        auVar26._12_4_ = auVar31._12_4_ + auVar21._12_4_;
        auVar26._16_4_ = auVar31._16_4_ + auVar21._16_4_;
        auVar26._20_4_ = auVar31._20_4_ + auVar21._20_4_;
        auVar26._24_4_ = auVar31._24_4_ + auVar21._24_4_;
        auVar26._28_4_ = auVar31._28_4_ + auVar21._28_4_;
        auVar3._4_4_ = auVar17._4_4_ * 128.0;
        auVar3._0_4_ = auVar17._0_4_ * 128.0;
        auVar3._8_4_ = auVar17._8_4_ * 128.0;
        auVar3._12_4_ = auVar17._12_4_ * 128.0;
        auVar3._16_4_ = auVar17._16_4_ * 128.0;
        auVar3._20_4_ = auVar17._20_4_ * 128.0;
        auVar3._24_4_ = auVar17._24_4_ * 128.0;
        auVar3._28_4_ = auVar17._28_4_;
        auVar3 = vcmpps_avx(auVar26,auVar3,1);
        auVar17 = vblendvps_avx(auVar20,auVar25,auVar3);
        in_ZMM13 = ZEXT3264(auVar17);
        auVar3 = vblendvps_avx(auVar21,auVar31,auVar3);
        auVar17 = vpshufb_avx2(auVar17,auVar28);
        pfVar1 = weight_set_out + uVar8;
        *pfVar1 = fVar10 + fVar5 * auVar3._0_4_;
        pfVar1[1] = fVar10 + fVar5 * auVar3._4_4_;
        pfVar1[2] = fVar10 + fVar5 * auVar3._8_4_;
        pfVar1[3] = fVar10 + fVar5 * auVar3._12_4_;
        pfVar1[4] = fVar10 + fVar5 * auVar3._16_4_;
        pfVar1[5] = fVar10 + fVar5 * auVar3._20_4_;
        pfVar1[6] = fVar10 + fVar5 * auVar3._24_4_;
        pfVar1[7] = fVar10 + auVar3._28_4_;
        auVar2 = vpunpckldq_avx(auVar17._0_16_,auVar17._16_16_);
        *(long *)(quantized_weight_set + uVar8) = auVar2._0_8_;
        uVar8 = uVar8 + 8;
      } while (uVar8 < uVar7);
    }
    return;
  }
  __assert_fail("weight_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0x3d8,
                "void compute_quantized_weights_for_decimation(const decimation_info &, float, float, const float *, float *, uint8_t *, quant_method)"
               );
}

Assistant:

void compute_quantized_weights_for_decimation(
	const decimation_info& di,
	float low_bound,
	float high_bound,
	const float* dec_weight_ideal_value,
	float* weight_set_out,
	uint8_t* quantized_weight_set,
	quant_method quant_level
) {
	int weight_count = di.weight_count;
	promise(weight_count > 0);
	const quant_and_transfer_table& qat = quant_and_xfer_tables[quant_level];

	// The available quant levels, stored with a minus 1 bias
	static const float quant_levels_m1[12] {
		1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 7.0f, 9.0f, 11.0f, 15.0f, 19.0f, 23.0f, 31.0f
	};

	vint steps_m1(get_quant_level(quant_level) - 1);
	float quant_level_m1 = quant_levels_m1[quant_level];

	// Quantize the weight set using both the specified low/high bounds and standard 0..1 bounds

	// TODO: Oddity to investigate; triggered by test in issue #265.
	if (high_bound <= low_bound)
	{
		low_bound = 0.0f;
		high_bound = 1.0f;
	}

	float rscale = high_bound - low_bound;
	float scale = 1.0f / rscale;

	float scaled_low_bound = low_bound * scale;
	rscale *= 1.0f / 64.0f;

	vfloat scalev(scale);
	vfloat scaled_low_boundv(scaled_low_bound);
	vfloat quant_level_m1v(quant_level_m1);
	vfloat rscalev(rscale);
	vfloat low_boundv(low_bound);

	// This runs to the rounded-up SIMD size, which is safe as the loop tail is filled with known
	// safe data in compute_ideal_weights_for_decimation and arrays are always 64 elements
	if (get_quant_level(quant_level) <= 16)
	{
		vtable_16x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
	else
	{
		vtable_32x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
}